

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O2

void secp256k1_hsort(void *ptr,size_t count,size_t size,_func_int_void_ptr_void_ptr_void_ptr *cmp,
                    void *cmp_data)

{
  ulong i;
  
  i = count >> 1;
  while (i = i - 1, i != 0xffffffffffffffff) {
    secp256k1_heap_down((uchar *)ptr,i,count,size,cmp,cmp_data);
  }
  while (1 < count) {
    count = count - 1;
    secp256k1_heap_swap((uchar *)ptr,0,count,size);
    secp256k1_heap_down((uchar *)ptr,0,count,size,cmp,cmp_data);
  }
  return;
}

Assistant:

static void secp256k1_hsort(void *ptr, size_t count, size_t size,
                            int (*cmp)(const void *, const void *, void *),
                            void *cmp_data) {
    size_t i;

    for (i = count/2; 0 < i; --i) {
        secp256k1_heap_down(ptr, i-1, count, size, cmp, cmp_data);
    }
    for (i = count; 1 < i; --i) {
        /* Extract the largest value from the heap */
        secp256k1_heap_swap(ptr, 0, i-1, size);

        /* Repair the heap condition */
        secp256k1_heap_down(ptr, 0, i-1, size, cmp, cmp_data);
    }
}